

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O1

bool __thiscall ASDCP::MXF::Rational::Unarchive(Rational *this,MemIOReader *Reader)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  
  if ((ulong)Reader->m_capacity < (ulong)Reader->m_size + 4) {
    bVar2 = false;
  }
  else {
    uVar3 = *(uint *)(Reader->m_p + Reader->m_size);
    (this->super_Rational).Numerator =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = Reader->m_size + 4;
    Reader->m_size = uVar3;
    uVar1 = (ulong)uVar3 + 4;
    bVar2 = uVar1 <= Reader->m_capacity;
    if (uVar1 <= Reader->m_capacity) {
      uVar3 = *(uint *)(Reader->m_p + uVar3);
      (this->super_Rational).Denominator =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      Reader->m_size = Reader->m_size + 4;
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }